

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O1

void scan_bitstream_mfm_fm(TrackData *trackdata)

{
  int *piVar1;
  ostream *poVar2;
  BitBuffer *this;
  pointer puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  uint16_t uVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  BitBuffer *pBVar15;
  LogHelper *pLVar16;
  pointer pSVar17;
  int iVar18;
  Sector *pSVar19;
  uint uVar20;
  int *piVar21;
  uint uVar22;
  EVP_PKEY_CTX *ctx;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  Encoding *t;
  int *piVar26;
  long lVar27;
  bool bVar28;
  CRC16 crc;
  uint8_t am;
  int am_offset;
  array<unsigned_char,_6UL> id;
  Header header;
  Sector s;
  vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> data_fields;
  Track track;
  CRC16 local_19c;
  byte local_199;
  undefined8 local_198;
  uint16_t local_18e;
  int local_18c;
  int local_188;
  char local_181;
  BitBuffer *local_180;
  array<unsigned_char,_6UL> local_172;
  uint local_16c;
  Sector *local_168;
  Sector *local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  int local_13c;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Base_ptr p_Stack_118;
  vector<Data,_std::allocator<Data>_> local_110;
  undefined1 local_f8 [32];
  _Base_ptr p_Stack_d8;
  pointer local_d0;
  TrackData *local_c8;
  int *local_c0;
  uint local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  int *local_a8;
  int *piStack_a0;
  long local_98;
  Track local_90;
  ulong local_70;
  int *local_68;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_60;
  
  Track::Track(&local_90,0);
  bVar28 = opt.a1sync == 0;
  local_c8 = trackdata;
  pBVar15 = TrackData::bitstream(trackdata);
  BitBuffer::seek(pBVar15,0);
  local_90.tracklen = BitBuffer::track_bitsize(pBVar15);
  CRC16::CRC16(&local_19c,0xffff);
  uVar24 = -(uint)bVar28 | 0xffdfffdf;
  local_a8 = (int *)0x0;
  piStack_a0 = (int *)0x0;
  local_98 = 0;
  t = &pBVar15->encoding;
  local_198 = (Sector *)((ulong)local_198._4_4_ << 0x20);
  uVar22 = 0;
  local_180 = pBVar15;
LAB_0013a968:
  do {
    bVar28 = BitBuffer::wrapped(pBVar15);
    pSVar19 = local_90.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((bVar28) ||
       ((iVar11 = Track::size(&local_90), iVar11 == 0 &&
        (iVar11 = BitBuffer::tell(pBVar15),
        pSVar19 = local_90.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_start, local_90.tracklen < iVar11)))) {
      do {
        do {
          do {
            if (pSVar19 ==
                local_90.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              TrackData::add(local_c8,&local_90);
              if (local_a8 != (int *)0x0) {
                operator_delete(local_a8,local_98 - (long)local_a8);
              }
              std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_90.m_sectors);
              return;
            }
            local_16c = pSVar19->encoding == FM | 4;
            iVar11 = 7 << (sbyte)local_16c;
            uVar22 = iVar11 + 0x290;
            if (pSVar19->datarate != _1M) {
              uVar22 = iVar11 + 0x160;
            }
            local_70 = (ulong)uVar22;
            local_198 = pSVar19;
            local_168 = local_90.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            bVar28 = Sector::has_badidcrc(pSVar19);
            pSVar19 = local_198 + 1;
            local_160 = pSVar19;
          } while (bVar28);
          if (opt.debug != 0) {
            pLVar16 = util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [22])"  s_b_mfm_fm finding ");
            pLVar16 = util::operator<<(pLVar16,&local_c8->cylhead);
            pLVar16 = util::operator<<(pLVar16,(char (*) [9])0x1b0f03);
            pLVar16 = util::operator<<(pLVar16,&(local_198->header).sector);
            util::operator<<(pLVar16,(char (*) [3])0x1ad441);
          }
          pSVar19 = local_160;
        } while (local_a8 == piStack_a0);
        local_b0 = (int)local_70 + 0x170;
        local_181 = local_160 != local_168;
        local_68 = &local_198->gap3;
        piVar21 = local_a8;
        do {
          local_c0 = piVar21 + 2;
          piVar26 = local_c0;
          if (local_c0 == piStack_a0) {
            piVar26 = local_a8;
          }
          cVar23 = '\v';
          if (piVar21[1] == local_198->encoding) {
            iVar12 = BitBuffer::track_offset(local_180,*piVar21);
            pBVar15 = local_180;
            iVar11 = 0;
            if (iVar12 < local_198->offset) {
              iVar11 = local_90.tracklen;
            }
            iVar11 = iVar11 + (iVar12 - local_198->offset);
            if (((int)local_70 <= iVar11) && (iVar11 <= local_b0)) {
              BitBuffer::seek(local_180,*piVar21);
              pBVar15->encoding = piVar21[1];
              bVar4 = BitBuffer::read_byte(pBVar15);
              ctx = (EVP_PKEY_CTX *)0xffff;
              if (piVar21[1] == 1) {
                ctx = (EVP_PKEY_CTX *)0xcdb4;
              }
              CRC16::init(&local_19c,ctx);
              local_ac = (uint)bVar4;
              CRC16::add(&local_19c,local_ac);
              if ((bVar4 == 0xfd) && (piVar21[1] == 2)) {
                local_198->encoding = RX02;
                piVar1 = &(local_198->header).size;
                *piVar1 = *piVar1 + 1;
                local_180->encoding = MFM;
                local_16c = 4;
              }
              pSVar17 = local_160;
              if (local_160 == local_168) {
                pSVar17 = local_90.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              }
              iVar13 = 0;
              iVar18 = pSVar17->offset - iVar12;
              iVar11 = 0;
              if (iVar18 == 0 || pSVar17->offset < iVar12) {
                iVar11 = local_90.tracklen;
              }
              uVar22 = iVar18 + iVar11;
              local_13c = (int)uVar22 >> ((byte)local_16c & 0x1f);
              local_b4 = -1 << ((byte)local_16c & 0x1f);
              iVar11 = *piVar26;
              if (iVar11 <= *piVar21) {
                iVar13 = BitBuffer::size(local_180);
              }
              lVar27 = (long)local_13c;
              iVar12 = (int)(lVar27 + -1);
              iVar11 = ((iVar13 + iVar11) - *piVar21 >> ((byte)local_16c & 0x1f)) + -1;
              if (opt.gap2 == 0) {
                iVar11 = iVar12;
              }
              if (local_160 == local_168) {
                iVar11 = iVar12;
              }
              iVar13 = iVar11 + -3;
              if (local_198->encoding != MFM) {
                iVar13 = iVar11;
              }
              if (iVar11 < 3) {
                iVar13 = iVar11;
              }
              local_b8 = uVar22;
              local_188 = Sector::size(local_198);
              local_188 = local_188 + 2;
              iVar11 = iVar13;
              if (iVar13 < local_188) {
                iVar11 = local_188;
              }
              iVar18 = BitBuffer::remaining(local_180);
              iVar18 = iVar18 >> ((byte)local_16c & 0x1f);
              if (iVar18 < local_188) {
                iVar14 = Sector::copies(local_198);
                if ((iVar14 != 0) &&
                   (bVar28 = Sector::is_8k_sector(local_198), iVar18 < 0x1802 || !bVar28)) {
                  if (opt.debug != 0) {
                    util::operator<<((LogHelper *)&util::cout,
                                     (char (*) [45])"  s_b_mfm_fm ignoring truncated sector copy\n")
                    ;
                  }
                  goto LAB_0013b835;
                }
                if (opt.debug != 0) {
                  util::operator<<((LogHelper *)&util::cout,
                                   (char (*) [55])
                                   "  s_b_mfm_fm using truncated sector data as only copy\n");
                }
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_158,(long)iVar11,(allocator_type *)local_138);
              BitBuffer::read<Data>(local_180,(Data *)&local_158);
              local_18e = CRC16::add(&local_19c,
                                     local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(long)local_188);
              if ((local_18e != 0) && (opt.debug != 0)) {
                iVar11 = Sector::size(local_198);
                bVar4 = local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar11];
                iVar11 = Sector::size(local_198);
                bVar5 = local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)iVar11 + 1];
                bVar6 = CRC16::msb(&local_19c);
                bVar7 = CRC16::lsb(&local_19c);
                util::fmt_abi_cxx11_
                          ((string *)local_138,
                           "  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",(ulong)bVar4
                           ,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7);
                util::operator<<((LogHelper *)&util::cout,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._0_8_ != &local_128) {
                  operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
                }
              }
              if ((opt.keepoverlap == 0) && (iVar11 = Sector::size(local_198), iVar13 < iVar11)) {
LAB_0013b444:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_158,(long)iVar13);
              }
              else {
                iVar11 = (int)local_158.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                puVar3 = local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar13 = Sector::size(local_198);
                if ((iVar13 < iVar11 - (int)puVar3) &&
                   ((opt.gaps == 0 || ((local_160 == local_168 && (opt.gap4b == 0)))))) {
                  iVar13 = Sector::size(local_198);
                  goto LAB_0013b444;
                }
              }
              iVar11 = local_13c + 6;
              iVar13 = (int)local_158.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_158.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              if (iVar13 < iVar11) {
                bVar28 = false;
              }
              else {
                bVar28 = true;
                if (((local_b8 & ~local_b4) == 0) &&
                   (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar27 + -1] == 0xfe)) {
                  bVar28 = test_remove_gap2((Data *)&local_158,iVar11);
                }
              }
              if (iVar13 < local_188) {
                bVar8 = false;
              }
              else if (local_160 == local_168) {
                bVar8 = test_remove_gap4b((Data *)&local_158,local_188);
              }
              else {
                bVar8 = test_remove_gap3((Data *)&local_158,local_188,local_68);
              }
              if (opt.gaps != 2) {
                if ((iVar11 <= iVar13 & bVar28) == 1) {
                  if (opt.debug != 0) {
                    util::operator<<((LogHelper *)&util::cout,
                                     (char (*) [33])"  s_b_mfm_fm removing gap2 data\n");
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_158,
                             (long)(int)(iVar12 + -3 + (uint)(local_198->encoding != MFM) * 3));
                }
                else if (opt.debug != 0 && iVar11 <= iVar13) {
                  util::operator<<((LogHelper *)&util::cout,
                                   (char (*) [36])"  s_b_mfm_fm skipping gap2 removal\n");
                }
                if ((local_188 <= iVar13) && (((bVar28 | iVar13 < iVar11) & bVar8) != 0)) {
                  if (local_160 == local_168) {
                    if (opt.debug != 0) {
                      util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [34])"  s_b_mfm_fm removing gap4b data\n");
                    }
                  }
                  else if (opt.debug != 0) {
                    util::operator<<((LogHelper *)&util::cout,
                                     (char (*) [33])"  s_b_mfm_fm removing gap3 data\n");
                  }
                  iVar11 = Sector::size(local_198);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_158,(long)iVar11);
                }
              }
              local_138._8_4_ = _S_red;
              local_128._M_allocated_capacity = 0;
              local_128._8_8_ = local_138 + 8;
              local_110.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              p_Stack_118 = (_Base_ptr)local_128._8_8_;
              bVar28 = Sector::is_8k_sector(local_198);
              if (bVar28) {
                ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                                 *)local_f8,
                                local_158.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (int)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                                (int)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                std::
                _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                ::clear((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                         *)local_138);
                if (local_f8._16_8_ != 0) {
                  local_138._8_4_ = local_f8._8_4_;
                  local_128._M_allocated_capacity = local_f8._16_8_;
                  local_128._8_8_ = local_f8._24_8_;
                  p_Stack_118 = p_Stack_d8;
                  *(undefined1 **)(local_f8._16_8_ + 8) = local_138 + 8;
                  local_110.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                  super__Vector_impl_data._M_start = local_d0;
                  local_f8._16_8_ = 0;
                  local_f8._24_8_ = local_f8 + 8;
                  local_d0 = (pointer)0x0;
                  p_Stack_d8 = (_Base_ptr)local_f8._24_8_;
                }
                std::
                _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                             *)local_f8);
                if (opt.debug != 0) {
                  pLVar16 = util::operator<<((LogHelper *)&util::cout,
                                             (char (*) [29])"  s_b_mfm_fm chk8k_method = ");
                  std::
                  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                  ::_Rb_tree(&local_60,
                             (_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                              *)local_138);
                  ChecksumName_abi_cxx11_
                            ((string *)local_f8,
                             (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                              *)&local_60);
                  pLVar16 = util::operator<<(pLVar16,(string *)local_f8);
                  local_172._M_elems[0] = 10;
                  util::operator<<(pLVar16,(char *)&local_172);
                  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                  }
                  std::
                  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                  ::~_Rb_tree(&local_60);
                }
              }
              if ((local_18e == 0 && local_181 == '\0') &&
                 (iVar11 = BitBuffer::track_offset
                                     (local_180,(local_188 << ((byte)local_16c & 0x1f)) + *piVar21),
                 iVar11 < *piVar21)) {
                iVar12 = BitBuffer::splicepos(local_180);
                if (iVar12 < iVar11) {
                  iVar12 = iVar11;
                }
                BitBuffer::splicepos(local_180,iVar12);
              }
              Sector::add(local_198,(Data *)&local_158,local_18e != 0,(uint8_t)local_ac);
              bVar28 = local_18e == 0;
              bVar8 = local_110.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0;
              std::
              _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
              ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                           *)local_138);
              if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (uint8_t *)0x0) {
                operator_delete(local_158.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_158.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_158.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              cVar23 = (bVar28 || bVar8) * '\t';
            }
          }
LAB_0013b835:
          pSVar19 = local_160;
        } while (((cVar23 == '\v') || (cVar23 == '\0')) &&
                (piVar21 = local_c0, local_c0 != piStack_a0));
      } while( true );
    }
    bVar4 = BitBuffer::read1(pBVar15);
    uVar22 = (uint)bVar4 | uVar22 * 2;
    if ((uVar22 & uVar24) != 0x44894489) goto LAB_0013a9d8;
    uVar9 = BitBuffer::read16(pBVar15);
  } while ((uVar9 & uVar24) != 0x4489);
  pBVar15->encoding = MFM;
  uVar10 = 0xcdb4;
  goto LAB_0013aa37;
LAB_0013a9d8:
  if (opt.encoding != MFM) {
    if ((int)uVar22 < -0x55ddd576) {
      if ((0x22 < uVar22 + 0x55ddd778) ||
         ((0x500000005U >> ((ulong)(uVar22 + 0x55ddd778) & 0x3f) & 1) == 0)) goto LAB_0013a968;
    }
    else if (((uVar22 != 0xaa222a8a) && (uVar22 != 0xaa2a2a88)) && (uVar22 != 0xaa222aa8))
    goto LAB_0013a968;
    iVar11 = BitBuffer::tell(pBVar15);
    BitBuffer::seek(pBVar15,iVar11 + -0x20);
    pBVar15->encoding = FM;
    uVar10 = 0xffff;
LAB_0013aa37:
    CRC16::init(&local_19c,(EVP_PKEY_CTX *)(ulong)uVar10);
    local_18c = BitBuffer::tell(pBVar15);
    local_199 = BitBuffer::read_byte(pBVar15);
    CRC16::add(&local_19c,(uint)local_199);
    this = local_180;
    pBVar15 = local_180;
    switch(local_199) {
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfd:
      if (*t == FM) {
        uVar20 = (uint)local_199;
        if ((byte)local_198 != -2) break;
      }
      else {
        uVar20 = (uint)local_198;
      }
      if (opt.debug != 0) {
        pLVar16 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
        pLVar16 = util::operator<<(pLVar16,t);
        pLVar16 = util::operator<<(pLVar16,(char (*) [10])0x1ab711);
        pLVar16 = util::operator<<(pLVar16,&local_199);
        pLVar16 = util::operator<<(pLVar16,(char (*) [13])") at offset ");
        pLVar16 = util::operator<<(pLVar16,&local_18c);
        pLVar16 = util::operator<<(pLVar16,(char (*) [3])0x1ae47c);
        iVar11 = BitBuffer::track_offset(local_180,local_18c);
        local_138._0_4_ = iVar11;
        pLVar16 = util::operator<<(pLVar16,(int *)local_138);
        util::operator<<(pLVar16,(char (*) [3])0x1af67c);
      }
      local_138._4_4_ = *t;
      local_138._0_4_ = local_18c;
      std::vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>>::
      emplace_back<std::pair<int,Encoding>>
                ((vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>> *)
                 &local_a8,(pair<int,_Encoding> *)local_138);
      local_198 = (Sector *)CONCAT44(local_198._4_4_,uVar20);
      pBVar15 = local_180;
      break;
    case 0xfc:
      if (opt.debug != 0) {
        pLVar16 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
        pLVar16 = util::operator<<(pLVar16,t);
        pLVar16 = util::operator<<(pLVar16,(char (*) [16])" IAM at offset ");
        pLVar16 = util::operator<<(pLVar16,&local_18c);
        pLVar16 = util::operator<<(pLVar16,(char (*) [3])0x1ae47c);
        iVar11 = BitBuffer::track_offset(local_180,local_18c);
        local_138._0_4_ = iVar11;
        pLVar16 = util::operator<<(pLVar16,(int *)local_138);
        util::operator<<(pLVar16,(char (*) [3])0x1af67c);
        pBVar15 = local_180;
      }
      break;
    case 0xfe:
      BitBuffer::read<std::array<unsigned_char,6ul>>(local_180,&local_172);
      CRC16::add(&local_19c,&local_172,6);
      uVar9 = CRC16::operator_cast_to_unsigned_short(&local_19c);
      if ((uVar9 == 0) || ((pBVar15 = local_180, opt.idcrc == 1 && (this->encoding != FM)))) {
        Header::Header((Header *)&local_158,(uint)local_172._M_elems[0],(uint)local_172._M_elems[1],
                       (uint)local_172._M_elems[2],(uint)local_172._M_elems[3]);
        Sector::Sector((Sector *)local_138,this->datarate,this->encoding,(Header *)&local_158,0);
        uVar9 = CRC16::operator_cast_to_unsigned_short(&local_19c);
        Sector::set_badidcrc((Sector *)local_138,uVar9 != 0);
        iVar11 = BitBuffer::track_offset(this,local_18c);
        local_128._8_4_ = iVar11;
        if (opt.debug != 0) {
          pLVar16 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
          pLVar16 = util::operator<<(pLVar16,t);
          pLVar16 = util::operator<<(pLVar16,(char (*) [11])0x1ab51d);
          pLVar16 = util::operator<<(pLVar16,(int *)&local_158.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
          pLVar16 = util::operator<<(pLVar16,(char (*) [13])") at offset ");
          pLVar16 = util::operator<<(pLVar16,&local_18c);
          pLVar16 = util::operator<<(pLVar16,(char (*) [3])0x1ae47c);
          pLVar16 = util::operator<<(pLVar16,(int *)(local_128._M_local_buf + 8));
          util::operator<<(pLVar16,(char (*) [3])0x1af67c);
        }
        Track::add(&local_90,(Sector *)local_138);
        if ((opt.debug != 0) &&
           (uVar9 = CRC16::operator_cast_to_unsigned_short(&local_19c), uVar9 != 0)) {
          uVar25 = (ulong)local_172._M_elems[4];
          local_c0 = (int *)CONCAT44(local_c0._4_4_,(uint)local_172._M_elems[5]);
          bVar4 = CRC16::msb(&local_19c);
          bVar5 = CRC16::lsb(&local_19c);
          util::fmt_abi_cxx11_
                    ((string *)local_f8,"  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                     uVar25,(ulong)local_c0 & 0xffffffff,(ulong)bVar4,(ulong)bVar5);
          util::operator<<((LogHelper *)&util::cout,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8);
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
        }
        bVar4 = local_199;
        if (*t != FM) {
          bVar4 = (byte)local_198;
        }
        local_198 = (Sector *)CONCAT44(local_198._4_4_,(uint)bVar4);
        std::vector<Data,_std::allocator<Data>_>::~vector(&local_110);
        pBVar15 = local_180;
      }
      break;
    default:
      if (opt.debug != 0) {
        pLVar16 = util::operator<<((LogHelper *)&util::cout,(char (*) [20])"s_b_mfm_fm unknown ");
        pLVar16 = util::operator<<(pLVar16,t);
        pLVar16 = util::operator<<(pLVar16,(char (*) [6])0x1ae479);
        if (pLVar16->clearline == true) {
          pLVar16->clearline = false;
          util::operator<<(pLVar16,clearline);
        }
        poVar2 = pLVar16->screen;
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar2 = pLVar16->file;
        if ((poVar2 != (ostream *)0x0) && (pLVar16->statusmsg == false)) {
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        }
        pLVar16 = util::operator<<(pLVar16,&local_199);
        if (pLVar16->clearline == true) {
          pLVar16->clearline = false;
          util::operator<<(pLVar16,clearline);
        }
        poVar2 = pLVar16->screen;
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = pLVar16->file;
        if ((poVar2 != (ostream *)0x0) && (pLVar16->statusmsg == false)) {
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        }
        pLVar16 = util::operator<<(pLVar16,(char (*) [13])") at offset ");
        pLVar16 = util::operator<<(pLVar16,&local_18c);
        pLVar16 = util::operator<<(pLVar16,(char (*) [5])0x1b1b5f);
        pLVar16 = util::operator<<(pLVar16,&local_c8->cylhead);
        util::operator<<(pLVar16,(char (*) [2])0x1ad42e);
        pBVar15 = local_180;
      }
    }
  }
  goto LAB_0013a968;
}

Assistant:

void scan_bitstream_mfm_fm(TrackData& trackdata)
{
    Track track;
    uint32_t sync_mask = opt.a1sync ? 0xffdfffdf : 0xffffffff;

    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);
    track.tracklen = bitbuf.track_bitsize();

    CRC16 crc;
    std::vector<std::pair<int, Encoding>> data_fields;

    uint32_t dword = 0;
    uint8_t last_fm_am = 0;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        dword = (dword << 1) | bitbuf.read1();

        if ((dword & sync_mask) == 0x44894489)
        {
            if ((bitbuf.read16() & sync_mask) != 0x4489) continue;

            bitbuf.encoding = Encoding::MFM;
            crc.init(CRC16::A1A1A1);
        }
        else if (opt.encoding == Encoding::MFM) // FM disabled?
            continue;
        else
        {
            // Check for known FM address marks
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                break;

                // Not a recognised FM mark, so keep searching
            default:
                continue;
            }

            // With FM the address mark is also the sync, so step back to read it again
            bitbuf.seek(bitbuf.tell() - 32);

            bitbuf.encoding = Encoding::FM;
            crc.init();
        }

        auto am_offset = bitbuf.tell();
        auto am = bitbuf.read_byte();
        crc.add(am);

        switch (am)
        {
        case 0xfe:  // IDAM
        {
            std::array<uint8_t, 6> id;  // CHRN + 16-bit CRC
            bitbuf.read(id);

            // Check header CRC, skipping if it's bad, unless the user wants it.
            // Don't allow FM sectors with ID CRC errors, due to the false-positive risk.
            crc.add(id.data(), id.size());
            if (!crc || (opt.idcrc == 1 && bitbuf.encoding != Encoding::FM))
            {
                Header header(id[0], id[1], id[2], id[3]);
                Sector s(bitbuf.datarate, bitbuf.encoding, header);
                s.set_badidcrc(crc != 0);
                s.offset = bitbuf.track_offset(am_offset);

                if (opt.debug)
                    util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IDAM (id=" << header.sector << ") at offset " << am_offset << " (" << s.offset << ")\n";
                track.add(std::move(s));

                if (opt.debug && crc != 0)
                {
                    util::cout << util::fmt("  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                        id[4], id[5], crc.msb(), crc.lsb());
                }

                if (bitbuf.encoding == Encoding::FM)
                    last_fm_am = am;
            }
            break;
        }

        case 0xfb: case 0xfa:   // normal data (+alt)
        case 0xf8: case 0xf9:   // deleted data (+alt)
        case 0xfd:              // RX02
        {
            // FM address marks are short, so false positives are likely.
            if (bitbuf.encoding == Encoding::FM)
            {
                // Require a valid FM IDAM before we accept an FM DAM.
                if (last_fm_am != 0xfe)
                    break;

                last_fm_am = am;
            }

            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " DAM (am=" << am << ") at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            data_fields.push_back(std::make_pair(am_offset, bitbuf.encoding));
            break;
        }

        case 0xfc:  // IAM
            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IAM at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            break;

        default:
            if (opt.debug)
                util::cout << "s_b_mfm_fm unknown " << bitbuf.encoding << " AM (" << std::hex << am << std::dec << ") at offset " << am_offset << " on " << trackdata.cylhead << "\n";
            break;
        }
    }

    // Process each sector header to look for an associated data field
    for (auto it = track.begin(); it != track.end(); ++it)
    {
        auto& sector = *it;
        auto final_sector = std::next(it) == track.end();

        auto shift = (sector.encoding == Encoding::FM) ? 5 : 4;
        auto gap2_size = (sector.datarate == DataRate::_1M) ? GAP2_MFM_ED : GAP2_MFM_DDHD;  // gap2 size in MFM bytes (FM is half size but double encoding overhead)
        auto min_distance = ((1 + 6) << shift) + (gap2_size << 4);          // AM, ID, gap2 (fixed shift as FM is half size)
        auto max_distance = ((1 + 6) << shift) + ((23 + gap2_size) << 4);       // 1=AM, 6=ID, 21+gap2=max WD177x offset (gap2 may be longer when formatted by different type of controller)

        // If the header has a CRC error, the data can't be reached
        if (sector.has_badidcrc())
            continue;

        if (opt.debug)
            util::cout << "  s_b_mfm_fm finding " << trackdata.cylhead << " sector " << sector.header.sector << ":\n";

        for (auto itData = data_fields.begin(); itData != data_fields.end(); ++itData)
        {
            const auto& dam_offset = itData->first;
            const Encoding& data_encoding = itData->second;
            auto itDataNext = (std::next(itData) == data_fields.end()) ? data_fields.begin() : std::next(itData);

            // Data field must be the same encoding type
            if (data_encoding != sector.encoding)
                continue;

            // Determine distance from header to data field, taking care of track wrapping
            auto dam_track_offset = bitbuf.track_offset(dam_offset);
            auto distance = ((dam_track_offset < sector.offset) ? track.tracklen : 0) + dam_track_offset - sector.offset;

            // Reject if the data field is too close or too far away
            if (distance < min_distance || distance > max_distance)
                continue;

            bitbuf.seek(dam_offset);
            bitbuf.encoding = data_encoding;

            auto dam = bitbuf.read_byte();
            crc.init((data_encoding == Encoding::MFM) ? CRC16::A1A1A1 : CRC16::INIT_CRC);
            crc.add(dam);

            // RX02 modified MFM uses an FM DAM followed by MFM data and CRC.
            if (data_encoding == Encoding::FM && dam == 0xfd)
            {
                // Convert the sector to RX02, its size to match the data.
                sector.encoding = Encoding::RX02;
                ++sector.header.size;

                // Switch to decoding the data as MFM.
                bitbuf.encoding = Encoding::MFM;
                shift = 4;
            }

            // Determine the offset and distance to the next IDAM, taking care of track wrap if it's the final sector
            auto next_idam_offset = final_sector ? track.begin()->offset : std::next(it)->offset;
            auto next_idam_distance = ((next_idam_offset <= dam_track_offset) ? track.tracklen : 0) + next_idam_offset - dam_track_offset;
            auto next_idam_bytes = (next_idam_distance >> shift) - 1;   // -1 due to DAM being read above
            auto next_idam_align = next_idam_distance & ((1 << shift) - 1);

            // Determine the bit offset and distance to the next DAM
            auto next_dam_offset = itDataNext->first;
            auto next_dam_distance = ((next_dam_offset <= dam_offset) ? bitbuf.size() : 0) + next_dam_offset - dam_offset;
            auto next_dam_bytes = (next_dam_distance >> shift) - 1;     // -1 due to DAM being read above

            // Attempt to read gap2 from non-final sectors, unless we're asked not to
            auto read_gap2 = !final_sector && (opt.gap2 != 0);

            // Calculate the extent of the current data field, up to the next header or data field (depending if gap2 is required)
            auto extent_bytes = read_gap2 ? next_dam_bytes : next_idam_bytes;
            if (extent_bytes >= 3 && sector.encoding == Encoding::MFM) extent_bytes -= 3;   // remove A1A1A1

            auto normal_bytes = sector.size() + 2;                  // data size + CRC bytes
            auto data_bytes = std::max(normal_bytes, extent_bytes); // data size needed to check CRC

            // Calculate bytes remaining in the data in current data encoding
            auto avail_bytes = bitbuf.remaining() >> shift;

            // Ignore truncated copies, unless it's the only copy we have
            if (avail_bytes < normal_bytes)
            {
                // If we've already got a copy, ignore the truncated version
                if (sector.copies() && (!sector.is_8k_sector() || avail_bytes < 0x1802))    // ToDo: fix nasty check
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm ignoring truncated sector copy\n";
                    continue;
                }

                if (opt.debug)
                    util::cout << "  s_b_mfm_fm using truncated sector data as only copy\n";
            }

            // Read the full data field and check its CRC
            Data data(data_bytes);
            bitbuf.read(data);
            bool bad_crc = crc.add(data.data(), normal_bytes) != 0;
            if (opt.debug && bad_crc)
            {
                util::cout << util::fmt("  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",
                    data[sector.size()], data[sector.size() + 1], crc.msb(), crc.lsb());
            }

            // Truncate at the extent size, unless we're asked to keep overlapping sectors
            if (!opt.keepoverlap && extent_bytes < sector.size())
                data.resize(extent_bytes);
            else if (data.size() > sector.size() && (opt.gaps == GAPS_NONE || (opt.gap4b == 0 && final_sector)))
                data.resize(sector.size());

            auto gap2_offset = next_idam_bytes + 1 + 4 + 2;
            auto has_gap2 = data.size() >= gap2_offset;
            auto has_gap3_4b = data.size() >= normal_bytes;
            auto remove_gap2 = false;
            auto remove_gap3_4b = false;

            // Check IDAM bit alignment and value, as AnglaisCollege\track00.0.raw has rogue FE junk on cyls 22+26
            if (has_gap2)
                remove_gap2 = next_idam_align != 0 || data[next_idam_bytes] != 0xfe || test_remove_gap2(data, gap2_offset);

            if (has_gap3_4b)
            {
                if (final_sector)
                    remove_gap3_4b = test_remove_gap4b(data, normal_bytes);
                else
                    remove_gap3_4b = test_remove_gap3(data, normal_bytes, sector.gap3);
            }

            if (opt.gaps != GAPS_ALL)
            {
                if (has_gap2 && remove_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm removing gap2 data\n";
                    data.resize(next_idam_bytes - ((sector.encoding == Encoding::MFM) ? 3 : 0));
                }
                else if (has_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm skipping gap2 removal\n";
                }

                if (has_gap3_4b && remove_gap3_4b && (!has_gap2 || remove_gap2))
                {
                    if (!final_sector)
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap3 data\n";
                        data.resize(sector.size());
                    }
                    else
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap4b data\n";
                        data.resize(sector.size());
                    }
                }
            }

            // If it's an 8K sector, attempt to validate any embedded checksum
            std::set<ChecksumType> chk8k_methods;
            if (sector.is_8k_sector())
            {
                chk8k_methods = ChecksumMethods(data.data(), data.size());
                if (opt.debug)
                    util::cout << "  s_b_mfm_fm chk8k_method = " << ChecksumName(chk8k_methods) << '\n';
            }

            // Consider good sectors overhanging the index
            if (final_sector && !bad_crc)
            {
                auto splice_offset = bitbuf.track_offset(dam_offset + (normal_bytes << shift));
                if (splice_offset < dam_offset)
                    bitbuf.splicepos(std::max(splice_offset, bitbuf.splicepos()));
            }

            sector.add(std::move(data), bad_crc, dam);

            // If the data is good there's no need to search for more data fields
            if (!bad_crc || !chk8k_methods.empty())
                break;
        }
    }

    trackdata.add(std::move(track));
}